

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.h
# Opt level: O0

string * __thiscall
spvtools::val::ValidationState_t::SpvDecorationString_abi_cxx11_
          (string *__return_storage_ptr__,ValidationState_t *this,uint32_t decoration)

{
  char *__s;
  spv_result_t sVar1;
  allocator<char> local_2a;
  allocator<char> local_29;
  spv_operand_desc local_28;
  spv_operand_desc desc;
  ValidationState_t *pVStack_18;
  uint32_t decoration_local;
  ValidationState_t *this_local;
  
  local_28 = (spv_operand_desc)0x0;
  desc._4_4_ = decoration;
  pVStack_18 = this;
  this_local = (ValidationState_t *)__return_storage_ptr__;
  sVar1 = AssemblyGrammar::lookupOperand
                    (&this->grammar_,SPV_OPERAND_TYPE_DECORATION,decoration,&local_28);
  if (sVar1 == SPV_SUCCESS) {
    __s = local_28->name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,__s,&local_2a);
    std::allocator<char>::~allocator(&local_2a);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Unknown",&local_29);
    std::allocator<char>::~allocator(&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SpvDecorationString(uint32_t decoration) {
    spv_operand_desc desc = nullptr;
    if (grammar_.lookupOperand(SPV_OPERAND_TYPE_DECORATION, decoration,
                               &desc) != SPV_SUCCESS) {
      return std::string("Unknown");
    }
    return std::string(desc->name);
  }